

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<QXdgDesktopPortalFileDialog::Filter*>,long_long>
               (reverse_iterator<QXdgDesktopPortalFileDialog::Filter_*> first,longlong n,
               reverse_iterator<QXdgDesktopPortalFileDialog::Filter_*> d_first)

{
  undefined8 uVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  FilterCondition *pFVar5;
  int *piVar6;
  Filter *pFVar7;
  reverse_iterator<QXdgDesktopPortalFileDialog::Filter_*> *prVar8;
  Filter *pFVar9;
  Filter *pFVar10;
  Filter *pFVar11;
  Filter *pFVar12;
  long in_FS_OFFSET;
  Destructor local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.iter = &local_58.intermediate;
  local_58.end.current = (Filter *)((d_first.current)->name).d.d;
  pFVar11 = local_58.end.current + -n;
  pFVar12 = (Filter *)((first.current)->name).d.d;
  pFVar9 = local_58.end.current;
  pFVar7 = pFVar11;
  pFVar10 = pFVar12;
  if (pFVar11 < pFVar12) {
    pFVar7 = pFVar12;
    pFVar10 = pFVar11;
  }
  while (pFVar9 != pFVar7) {
    uVar1 = *(undefined8 *)&pFVar12[-1].name.d.d;
    *(undefined8 *)&pFVar12[-1].name.d.d = 0;
    *(undefined8 *)&pFVar9[-1].name.d.d = uVar1;
    pcVar2 = pFVar12[-1].name.d.ptr;
    pFVar12[-1].name.d.ptr = (char16_t *)0x0;
    pFVar9[-1].name.d.ptr = pcVar2;
    qVar3 = pFVar12[-1].name.d.size;
    pFVar12[-1].name.d.size = 0;
    pFVar9[-1].name.d.size = qVar3;
    pDVar4 = pFVar12[-1].filterConditions.d.d;
    pFVar12[-1].filterConditions.d.d = (Data *)0x0;
    pFVar9[-1].filterConditions.d.d = pDVar4;
    pFVar5 = pFVar12[-1].filterConditions.d.ptr;
    pFVar12[-1].filterConditions.d.ptr = (FilterCondition *)0x0;
    pFVar9[-1].filterConditions.d.ptr = pFVar5;
    qVar3 = pFVar12[-1].filterConditions.d.size;
    pFVar12[-1].filterConditions.d.size = 0;
    pFVar9[-1].filterConditions.d.size = qVar3;
    ((d_first.current)->name).d.d = ((d_first.current)->name).d.d + -3;
    pFVar12 = (Filter *)(((first.current)->name).d.d + -3);
    ((first.current)->name).d.d = (Data *)pFVar12;
    pFVar9 = (Filter *)((d_first.current)->name).d.d;
  }
  local_58.intermediate.current = pFVar9;
  while (prVar8 = &local_58.end, pFVar9 != pFVar11) {
    uVar1 = *(undefined8 *)&pFVar9[-1].name.d.d;
    *(undefined8 *)&pFVar9[-1].name.d.d = *(undefined8 *)&pFVar12[-1].name.d.d;
    *(undefined8 *)&pFVar12[-1].name.d.d = uVar1;
    pcVar2 = pFVar9[-1].name.d.ptr;
    pFVar9[-1].name.d.ptr = pFVar12[-1].name.d.ptr;
    pFVar12[-1].name.d.ptr = pcVar2;
    qVar3 = pFVar9[-1].name.d.size;
    pFVar9[-1].name.d.size = pFVar12[-1].name.d.size;
    pFVar12[-1].name.d.size = qVar3;
    QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>::operator=
              (&pFVar9[-1].filterConditions.d,&pFVar12[-1].filterConditions.d);
    ((d_first.current)->name).d.d = ((d_first.current)->name).d.d + -3;
    pFVar12 = (Filter *)(((first.current)->name).d.d + -3);
    ((first.current)->name).d.d = (Data *)pFVar12;
    pFVar9 = (Filter *)((d_first.current)->name).d.d;
  }
  while (local_58.iter = prVar8, pFVar12 != pFVar10) {
    ((first.current)->name).d.d = (Data *)(pFVar12 + 1);
    QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>::~QArrayDataPointer
              (&(pFVar12->filterConditions).d);
    piVar6 = *(int **)&(pFVar12->name).d.d;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pFVar12->name).d.d,2,0x10);
      }
    }
    prVar8 = local_58.iter;
    pFVar12 = (Filter *)((first.current)->name).d.d;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QXdgDesktopPortalFileDialog::Filter_*>,_long_long>
  ::Destructor::~Destructor(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}